

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_forage(CHAR_DATA *ch,char *argument)

{
  int vnum;
  int iVar1;
  int iVar2;
  CClass *this;
  OBJ_DATA *pOVar3;
  long in_RDI;
  int found;
  int chance;
  OBJ_DATA *berry_2;
  OBJ_DATA *berry_1;
  int in_stack_0000007c;
  OBJ_INDEX_DATA *in_stack_00000080;
  int in_stack_000000a4;
  bool in_stack_000000ab;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  CHAR_DATA *ch_00;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  char_data *in_stack_ffffffffffffffe0;
  
  vnum = get_skill(in_stack_000000d0,in_stack_000000cc);
  if (vnum != 0) {
    iVar1 = (int)*(short *)(in_RDI + 0x138);
    ch_00 = (CHAR_DATA *)(skill_table + gsn_forage);
    this = char_data::Class(in_stack_ffffffffffffffe0);
    iVar2 = CClass::GetIndex(this);
    if (*(short *)((long)&ch_00->next_in_room + (long)iVar2 * 2) <= iVar1) {
      if (*(short *)(*(long *)(in_RDI + 0xa8) + 0x150) != 3) {
        send_to_char((char *)in_stack_ffffffffffffffe0,
                     (CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffd8));
        return;
      }
      if (0x5a < vnum) {
        vnum = 0x5a;
      }
      iVar2 = number_percent();
      if (vnum < iVar2) {
        act((char *)in_stack_ffffffffffffffe0,(CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffd8),
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),ch_00,0);
        send_to_char((char *)in_stack_ffffffffffffffe0,
                     (CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffd8));
        check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
        WAIT_STATE(in_stack_ffffffffffffffe0,vnum);
        return;
      }
      act((char *)in_stack_ffffffffffffffe0,(CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffd8),
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),ch_00,0);
      send_to_char((char *)in_stack_ffffffffffffffe0,
                   (CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffd8));
      check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
      iVar2 = number_range(in_stack_ffffffffffffffd0,(int)((ulong)ch_00 >> 0x20));
      get_obj_index(vnum);
      pOVar3 = create_object(in_stack_00000080,in_stack_0000007c);
      if (pOVar3 == (OBJ_DATA *)0x0) {
        return;
      }
      obj_to_char((OBJ_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),ch_00);
      if (iVar2 < 2) {
        return;
      }
      get_obj_index(vnum);
      create_object(in_stack_00000080,in_stack_0000007c);
      obj_to_char((OBJ_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),ch_00);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffffe0,
               (CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

void do_forage(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *berry_1;
	OBJ_DATA *berry_2;
	int chance, found;

	chance = get_skill(ch, gsn_forage);

	if (chance == 0
		|| ch->level < skill_table[gsn_forage].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You aren't able to decide on which plants are edible.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type != SECT_FOREST)
	{
		send_to_char("You aren't in a suitable forest region where you can apply your plant lore.\n\r", ch);
		return;
	}

	if (chance > 90)
		chance = 90;

	if (number_percent() > chance)
	{
		act("$n messes about in the undergrowth but comes up looking perplexed.", ch, 0, 0, TO_ROOM);
		send_to_char("You search around but find nothing you can recognise as edible.\n\r", ch);
		check_improve(ch, gsn_forage, false, 2);
		WAIT_STATE(ch, 12);
		return;
	}

	act("$n messes about in the nearby bushes and comes out with some berries.", ch, 0, 0, TO_ROOM);
	send_to_char("You search around and find some edible berries in the bushes.\n\r", ch);
	check_improve(ch, gsn_forage, true, 2);

	found = number_range(1, 3);

	berry_1 = create_object(get_obj_index(OBJ_VNUM_BERRY), 1);
	if (berry_1 == nullptr)
		return;

	obj_to_char(berry_1, ch);

	if (found >= 2)
	{
		berry_2 = create_object(get_obj_index(OBJ_VNUM_BERRY), 1);
		obj_to_char(berry_2, ch);
	}
	/*
	if (found >= 3)
	{
		berry_3 = create_object(get_obj_index(OBJ_VNUM_BERRY),1);
		obj_to_char(berry_3,ch);
	}

	if (found >= 4)
	{
		berry_4 = create_object(get_obj_index(OBJ_VNUM_BERRY),1);
		obj_to_char(berry_4,ch);
	}
	*/
}